

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.h
# Opt level: O0

int __thiscall Consensus::Params::DeploymentHeight(Params *this,BuriedDeployment dep)

{
  long lVar1;
  undefined2 in_SI;
  long in_RDI;
  long in_FS_OFFSET;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_SI) {
  case 0xffff8000:
    local_c = *(int *)(in_RDI + 0x58);
    break;
  case 0xffff8001:
    local_c = *(int *)(in_RDI + 0x7c);
    break;
  case 0xffff8002:
    local_c = *(int *)(in_RDI + 0x80);
    break;
  case 0xffff8003:
    local_c = *(int *)(in_RDI + 0x84);
    break;
  case 0xffff8004:
    local_c = *(int *)(in_RDI + 0x88);
    break;
  default:
    local_c = std::numeric_limits<int>::max();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

int DeploymentHeight(BuriedDeployment dep) const
    {
        switch (dep) {
        case DEPLOYMENT_HEIGHTINCB:
            return BIP34Height;
        case DEPLOYMENT_CLTV:
            return BIP65Height;
        case DEPLOYMENT_DERSIG:
            return BIP66Height;
        case DEPLOYMENT_CSV:
            return CSVHeight;
        case DEPLOYMENT_SEGWIT:
            return SegwitHeight;
        } // no default case, so the compiler can warn about missing cases
        return std::numeric_limits<int>::max();
    }